

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

bool __thiscall Highs::aFormatOk(Highs *this,HighsInt num_nz,HighsInt format)

{
  bool bVar1;
  
  bVar1 = format - 1U < 2;
  if (!bVar1 && num_nz != 0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Non-empty Constraint matrix has illegal format = %d\n");
  }
  return bVar1 || num_nz == 0;
}

Assistant:

bool Highs::aFormatOk(const HighsInt num_nz, const HighsInt format) {
  if (!num_nz) return true;
  const bool ok_format = format == (HighsInt)MatrixFormat::kColwise ||
                         format == (HighsInt)MatrixFormat::kRowwise;
  assert(ok_format);
  if (!ok_format)
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Non-empty Constraint matrix has illegal format = %" HIGHSINT_FORMAT
        "\n",
        format);
  return ok_format;
}